

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdata.cpp
# Opt level: O1

int __thiscall ReadData::ReadBDSEph(ReadData *this,BUFF *socketdata,uchar *HeadBuff)

{
  ushort uVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  unsigned_short *Message;
  
  iVar4 = 6;
  if ((this->Head).MessageID == 0x6a0) {
    iVar4 = (this->Head).MessageLength;
    iVar2 = (int)((long)iVar4 + 4U);
    iVar5 = -1;
    if (-5 < iVar4) {
      iVar5 = iVar2;
    }
    Message = (unsigned_short *)operator_new__((long)iVar5);
    iVar5 = socketdata->pos;
    if (socketdata->len - iVar5 < iVar4) {
      socketdata->pos = iVar5 + -0x1c;
      iVar4 = 2;
    }
    else {
      memcpy(Message,socketdata->buff + iVar5,(long)iVar4 + 4U);
      socketdata->pos = iVar5 + iVar2;
      bVar3 = CRCCheck(HeadBuff,(uchar *)Message,iVar4,0xc4);
      if (bVar3) {
        uVar1 = *Message - 1;
        iVar4 = 4;
        if (uVar1 < 0x41) {
          this->BDSEph[uVar1].PRN = *Message;
          this->BDSEph[uVar1].sys = BDS;
          this->BDSEph[uVar1].RefTime.Week = *(int *)(Message + 2);
          this->BDSEph[uVar1].URA = *(double *)(Message + 4);
          this->BDSEph[uVar1].HealthStatus = *(int *)(Message + 8);
          this->BDSEph[uVar1].tgd = *(double *)(Message + 10);
          this->BDSEph[uVar1].tgd2 = *(double *)(Message + 0xe);
          this->BDSEph[uVar1].toc = (double)*(int *)(Message + 0x14);
          this->BDSEph[uVar1].af0 = *(double *)(Message + 0x16);
          this->BDSEph[uVar1].af1 = *(double *)(Message + 0x1a);
          this->BDSEph[uVar1].af2 = *(double *)(Message + 0x1e);
          this->BDSEph[uVar1].RefTime.SOW = (double)*(int *)(Message + 0x24);
          this->BDSEph[uVar1].ecc = *(double *)(Message + 0x2a);
          this->BDSEph[uVar1].w = *(double *)(Message + 0x2e);
          this->BDSEph[uVar1].sqrtA = *(double *)(Message + 0x26);
          this->BDSEph[uVar1].deltaN = *(double *)(Message + 0x32);
          this->BDSEph[uVar1].M0 = *(double *)(Message + 0x36);
          this->BDSEph[uVar1].omegaO = *(double *)(Message + 0x3a);
          this->BDSEph[uVar1].omegaORate = *(double *)(Message + 0x3e);
          this->BDSEph[uVar1].I0 = *(double *)(Message + 0x42);
          this->BDSEph[uVar1].I0Rate = *(double *)(Message + 0x46);
          this->BDSEph[uVar1].cuc = *(double *)(Message + 0x4a);
          this->BDSEph[uVar1].cus = *(double *)(Message + 0x4e);
          this->BDSEph[uVar1].crc = *(double *)(Message + 0x52);
          this->BDSEph[uVar1].crs = *(double *)(Message + 0x56);
          this->BDSEph[uVar1].cic = *(double *)(Message + 0x5a);
          this->BDSEph[uVar1].cis = *(double *)(Message + 0x5e);
          operator_delete__(Message);
          iVar4 = 0;
        }
      }
      else {
        operator_delete__(Message);
        iVar4 = 3;
      }
    }
  }
  return iVar4;
}

Assistant:

int ReadData::ReadBDSEph(BUFF &socketdata, unsigned char* HeadBuff) {
    if(Head.MessageID != 1696)
        return CONFLICT_ID;
    
    char* buff = new char [Head.MessageLength + 4];
    if(socketdata.len - socketdata.pos < Head.MessageLength) {
        socketdata.pos -= 28;
        // reset(socketdata, pos);
        return FILE_OR_BUFF_END;
    }
    memcpy(buff, socketdata.buff + socketdata.pos, Head.MessageLength + 4);
    socketdata.pos += Head.MessageLength + 4;
    if(!CRCCheck(HeadBuff, (unsigned char*)buff, Head.MessageLength, 196)) {
        delete[] buff;
        return CRC_FAILED;
    }
    // cout << "BDS   " << endl;
    try
    {
        unsigned short int prn = U2I((unsigned char*)buff, 4) - 1;
        // cout << prn << endl;
        if(prn < 0 || prn > MAXBDSSRN)
            return INVALID_PRN;
        this->BDSEph[prn].PRN = prn + 1;
        this->BDSEph[prn].sys = BDS;

        this->BDSEph[prn].RefTime.Week = U2I((unsigned char*)(buff + 4), 4);
        this->BDSEph[prn].URA = C2D(buff + 8, 8);
        this->BDSEph[prn].HealthStatus = U2I((unsigned char*)(buff + 16), 4);
        this->BDSEph[prn].tgd = C2D(buff + 20, 8);
        this->BDSEph[prn].tgd2 = C2D(buff + 28, 8);
        this->BDSEph[prn].toc = U2I((unsigned char*)(buff + 40), 4);
        this->BDSEph[prn].af0 = C2D(buff + 44, 8);
        this->BDSEph[prn].af1 = C2D(buff + 52, 8);
        this->BDSEph[prn].af2 = C2D(buff + 60, 8);
        this->BDSEph[prn].RefTime.SOW = U2I((unsigned char*)(buff + 72), 4);
        this->BDSEph[prn].ecc = C2D((buff + 84), 8);
        this->BDSEph[prn].w = C2D(buff + 92, 8);
        this->BDSEph[prn].sqrtA = C2D(buff + 76, 8);
        this->BDSEph[prn].deltaN = C2D(buff + 100, 8);
        this->BDSEph[prn].M0 = C2D(buff + 108, 8);
        this->BDSEph[prn].omegaO = C2D(buff + 116, 8);
        this->BDSEph[prn].omegaORate = C2D(buff + 124, 8);
        this->BDSEph[prn].I0 = C2D(buff + 132, 8);
        this->BDSEph[prn].I0Rate = C2D(buff + 140, 8);
        this->BDSEph[prn].cuc = C2D(buff + 148, 8);
        this->BDSEph[prn].cus = C2D(buff + 156, 8);
        this->BDSEph[prn].crc = C2D(buff + 164, 8);
        this->BDSEph[prn].crs = C2D(buff + 172, 8);
        this->BDSEph[prn].cic = C2D(buff + 180, 8);
        this->BDSEph[prn].cis = C2D(buff + 188, 8);
        // cout << BDSEph[prn].sqrtA << endl;
    }
    catch(...)
    {
        cout << "error happened when reading bds eph" << endl;
        return UNSUPPORTED_MSG;
    }
    delete[] buff;
    return 0;
}